

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# superGate.c
# Opt level: O1

void Super_WriteLibraryTreeStr_rec
               (Vec_Str_t *vStr,Super_Man_t *pMan,Super_Gate_t_conflict *pSuper,int *pCounter)

{
  char cVar1;
  int iVar2;
  bool bVar3;
  ulong uVar4;
  uint uVar5;
  uint uVar6;
  char *pcVar7;
  size_t sVar8;
  char *pcVar9;
  ulong uVar10;
  size_t __size;
  long lVar11;
  ulong uVar12;
  char acStack_48 [24];
  
  if ((*(uint *)&pSuper->field_0x8 & 0xffffff01) != 0) {
    return;
  }
  uVar5 = Mio_GateReadPinNum(pSuper->pRoot);
  if (0 < (int)uVar5) {
    uVar12 = 0;
    do {
      Super_WriteLibraryTreeStr_rec(vStr,pMan,pSuper->pFanins[uVar12],pCounter);
      uVar12 = uVar12 + 1;
    } while (uVar5 != uVar12);
  }
  iVar2 = *pCounter;
  *pCounter = iVar2 + 1;
  uVar6 = *(uint *)&pSuper->field_0x8;
  *(uint *)&pSuper->field_0x8 = iVar2 << 8 | uVar6 & 0xff;
  if ((uVar6 & 2) != 0) {
    lVar11 = 0;
    do {
      cVar1 = " * "[lVar11 + 1];
      uVar6 = vStr->nCap;
      if (vStr->nSize == uVar6) {
        if ((int)uVar6 < 0x10) {
          if (vStr->pArray == (char *)0x0) {
            pcVar7 = (char *)malloc(0x10);
          }
          else {
            pcVar7 = (char *)realloc(vStr->pArray,0x10);
          }
          sVar8 = 0x10;
        }
        else {
          sVar8 = (ulong)uVar6 * 2;
          if ((int)sVar8 <= (int)uVar6) goto LAB_00410a86;
          if (vStr->pArray == (char *)0x0) {
            pcVar7 = (char *)malloc(sVar8);
          }
          else {
            pcVar7 = (char *)realloc(vStr->pArray,sVar8);
          }
        }
        vStr->pArray = pcVar7;
        vStr->nCap = (int)sVar8;
      }
LAB_00410a86:
      iVar2 = vStr->nSize;
      vStr->nSize = iVar2 + 1;
      vStr->pArray[iVar2] = cVar1;
      lVar11 = lVar11 + 1;
    } while (lVar11 != 2);
  }
  pcVar7 = Mio_GateReadName(pSuper->pRoot);
  sVar8 = strlen(pcVar7);
  if (0 < (int)(uint)sVar8) {
    uVar12 = 0;
    do {
      cVar1 = pcVar7[uVar12];
      uVar6 = vStr->nCap;
      if (vStr->nSize == uVar6) {
        if ((int)uVar6 < 0x10) {
          if (vStr->pArray == (char *)0x0) {
            pcVar9 = (char *)malloc(0x10);
          }
          else {
            pcVar9 = (char *)realloc(vStr->pArray,0x10);
          }
          __size = 0x10;
        }
        else {
          __size = (ulong)uVar6 * 2;
          if ((int)__size <= (int)uVar6) goto LAB_004107d4;
          if (vStr->pArray == (char *)0x0) {
            pcVar9 = (char *)malloc(__size);
          }
          else {
            pcVar9 = (char *)realloc(vStr->pArray,__size);
          }
        }
        vStr->pArray = pcVar9;
        vStr->nCap = (int)__size;
      }
LAB_004107d4:
      iVar2 = vStr->nSize;
      vStr->nSize = iVar2 + 1;
      vStr->pArray[iVar2] = cVar1;
      uVar12 = uVar12 + 1;
    } while (((uint)sVar8 & 0x7fffffff) != uVar12);
  }
  if (0 < (int)uVar5) {
    uVar12 = 0;
    do {
      uVar6 = vStr->nCap;
      if (vStr->nSize == uVar6) {
        if ((int)uVar6 < 0x10) {
          if (vStr->pArray == (char *)0x0) {
            pcVar7 = (char *)malloc(0x10);
          }
          else {
            pcVar7 = (char *)realloc(vStr->pArray,0x10);
          }
          sVar8 = 0x10;
        }
        else {
          sVar8 = (ulong)uVar6 * 2;
          if ((int)sVar8 <= (int)uVar6) goto LAB_0041086b;
          if (vStr->pArray == (char *)0x0) {
            pcVar7 = (char *)malloc(sVar8);
          }
          else {
            pcVar7 = (char *)realloc(vStr->pArray,sVar8);
          }
        }
        vStr->pArray = pcVar7;
        vStr->nCap = (int)sVar8;
      }
LAB_0041086b:
      iVar2 = vStr->nSize;
      vStr->nSize = iVar2 + 1;
      vStr->pArray[iVar2] = ' ';
      uVar6 = *(uint *)&pSuper->pFanins[uVar12]->field_0x8;
      if (uVar6 < 0x100) {
        uVar6 = vStr->nCap;
        if (vStr->nSize == uVar6) {
          if ((int)uVar6 < 0x10) {
            if (vStr->pArray == (char *)0x0) {
              pcVar7 = (char *)malloc(0x10);
            }
            else {
              pcVar7 = (char *)realloc(vStr->pArray,0x10);
            }
            vStr->pArray = pcVar7;
            sVar8 = 0x10;
          }
          else {
            sVar8 = (ulong)uVar6 * 2;
            if ((int)sVar8 <= (int)uVar6) goto LAB_004109d3;
            if (vStr->pArray == (char *)0x0) {
              pcVar7 = (char *)malloc(sVar8);
            }
            else {
              pcVar7 = (char *)realloc(vStr->pArray,sVar8);
            }
            vStr->pArray = pcVar7;
          }
          vStr->nCap = (int)sVar8;
        }
LAB_004109d3:
        iVar2 = vStr->nSize;
        vStr->nSize = iVar2 + 1;
        vStr->pArray[iVar2] = '0';
      }
      else {
        uVar4 = 0;
        uVar6 = uVar6 >> 8;
        do {
          uVar10 = uVar4;
          acStack_48[uVar10] = (char)uVar6 + (char)(uVar6 / 10) * -10;
          bVar3 = 9 < uVar6;
          uVar4 = uVar10 + 1;
          uVar6 = uVar6 / 10;
        } while (bVar3);
        do {
          cVar1 = acStack_48[uVar10 & 0xffffffff];
          uVar6 = vStr->nCap;
          if (vStr->nSize == uVar6) {
            if ((int)uVar6 < 0x10) {
              if (vStr->pArray == (char *)0x0) {
                pcVar7 = (char *)malloc(0x10);
              }
              else {
                pcVar7 = (char *)realloc(vStr->pArray,0x10);
              }
              sVar8 = 0x10;
            }
            else {
              sVar8 = (ulong)uVar6 * 2;
              if ((int)sVar8 <= (int)uVar6) goto LAB_0041095c;
              if (vStr->pArray == (char *)0x0) {
                pcVar7 = (char *)malloc(sVar8);
              }
              else {
                pcVar7 = (char *)realloc(vStr->pArray,sVar8);
              }
            }
            vStr->pArray = pcVar7;
            vStr->nCap = (int)sVar8;
          }
LAB_0041095c:
          iVar2 = vStr->nSize;
          vStr->nSize = iVar2 + 1;
          vStr->pArray[iVar2] = cVar1 + '0';
          uVar10 = uVar10 - 1;
        } while (1 < (int)uVar10 + 2);
      }
      uVar12 = uVar12 + 1;
    } while (uVar12 != uVar5);
  }
  uVar5 = vStr->nCap;
  if (vStr->nSize == uVar5) {
    if ((int)uVar5 < 0x10) {
      if (vStr->pArray == (char *)0x0) {
        pcVar7 = (char *)malloc(0x10);
      }
      else {
        pcVar7 = (char *)realloc(vStr->pArray,0x10);
      }
      sVar8 = 0x10;
    }
    else {
      sVar8 = (ulong)uVar5 * 2;
      if ((int)sVar8 <= (int)uVar5) goto LAB_00410ae5;
      if (vStr->pArray == (char *)0x0) {
        pcVar7 = (char *)malloc(sVar8);
      }
      else {
        pcVar7 = (char *)realloc(vStr->pArray,sVar8);
      }
    }
    vStr->pArray = pcVar7;
    vStr->nCap = (int)sVar8;
  }
LAB_00410ae5:
  iVar2 = vStr->nSize;
  vStr->nSize = iVar2 + 1;
  vStr->pArray[iVar2] = '\n';
  return;
}

Assistant:

void Super_WriteLibraryTreeStr_rec( Vec_Str_t * vStr, Super_Man_t * pMan, Super_Gate_t * pSuper, int * pCounter )
{
    int nFanins, i;
    // skip an elementary variable and a gate that was already written
    if ( pSuper->fVar || pSuper->Number > 0 )
        return;
    // write the fanins
    nFanins = Mio_GateReadPinNum(pSuper->pRoot);
    for ( i = 0; i < nFanins; i++ )
        Super_WriteLibraryTreeStr_rec( vStr, pMan, pSuper->pFanins[i], pCounter );
    // finally write the gate
    pSuper->Number = (*pCounter)++;
//    fprintf( pFile, "%s", pSuper->fSuper? "* " : "" );
//    fprintf( pFile, "%s", Mio_GateReadName(pSuper->pRoot) );
//    for ( i = 0; i < nFanins; i++ )
//        fprintf( pFile, " %d", pSuper->pFanins[i]->Number );
    Vec_StrPrintStr( vStr, pSuper->fSuper? "* " : "" );
    Vec_StrPrintStr( vStr, Mio_GateReadName(pSuper->pRoot) );
    for ( i = 0; i < nFanins; i++ )
    {
        Vec_StrPrintStr( vStr, " " );
        Vec_StrPrintNum( vStr, pSuper->pFanins[i]->Number );    
    }
    // write the formula 
    // this step is optional, the resulting library will work in any case
    // however, it may be helpful to for debugging to compare the same library 
    // written in the old format and written in the new format with formulas
//    fprintf( pFile, "    # %s", Super_WriteLibraryGateName( pSuper ) );
//    fprintf( pFile, "\n" );
    Vec_StrPrintStr( vStr, "\n" );
}